

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_memory_page * pugi::impl::anon_unknown_0::xml_memory_page::construct(void *memory)

{
  xml_memory_page *result;
  void *memory_local;
  
  *(undefined8 *)memory = 0;
  *(undefined8 *)((long)memory + 8) = 0;
  *(undefined8 *)((long)memory + 0x10) = 0;
  *(undefined8 *)((long)memory + 0x18) = 0;
  *(undefined8 *)((long)memory + 0x20) = 0;
  return (xml_memory_page *)memory;
}

Assistant:

static xml_memory_page* construct(void* memory)
		{
			xml_memory_page* result = static_cast<xml_memory_page*>(memory);

			result->allocator = 0;
			result->prev = 0;
			result->next = 0;
			result->busy_size = 0;
			result->freed_size = 0;

		#ifdef PUGIXML_COMPACT
			result->compact_string_base = 0;
			result->compact_shared_parent = 0;
			result->compact_page_marker = 0;
		#endif

			return result;
		}